

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *ctx,int start,char chr,int end)

{
  jsparser_ctx *js;
  char cVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char buffer [18];
  char acStack_38 [32];
  
  if (ctx == (statemachine_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c3,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  js = (jsparser_ctx *)ctx->user;
  if (js == (jsparser_ctx *)0x0) {
    __assert_fail("ctx->user != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x1c4,
                  "void ctemplate_htmlparser::enter_state_js_slash(statemachine_ctx *, int, char, int)"
                 );
  }
  iVar3 = js->buffer_end;
  iVar6 = iVar3 - js->buffer_start;
  iVar5 = (iVar3 + 0x12) - js->buffer_start;
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  if (0 < iVar5) {
    uVar7 = (iVar3 + -1) % 0x12;
    uVar2 = uVar7 + 0x12;
    if (-1 < (int)uVar7) {
      uVar2 = uVar7;
    }
    uVar8 = (ulong)(byte)js->buffer[uVar2];
    if (((uVar8 < 0x21) && ((0x100003e00U >> (uVar8 & 0x3f) & 1) != 0)) ||
       (js->buffer[uVar2] == 0xa0)) {
      if (iVar5 == 1) goto LAB_00130f08;
      uVar7 = (iVar3 + -2) % 0x12;
      uVar2 = uVar7 + 0x12;
      if (-1 < (int)uVar7) {
        uVar2 = uVar7;
      }
      uVar8 = (ulong)(byte)js->buffer[uVar2];
      iVar3 = -3;
    }
    else {
      iVar3 = -2;
    }
    if ((byte)uVar8 < 0x40) {
      if ((0xfc00956200000001U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x2b) {
          cVar1 = jsparser_buffer_get(js,iVar3);
          if (cVar1 == '+') goto LAB_00130f10;
        }
        else {
          if (uVar8 != 0x2d) goto LAB_00130ef0;
          cVar1 = jsparser_buffer_get(js,iVar3);
          if (cVar1 == '-') goto LAB_00130f10;
        }
      }
    }
    else {
LAB_00130ef0:
      uVar2 = (int)uVar8 - 0x5b;
      if (((0x23 < uVar2) || ((0xf00000009U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
         ((iVar3 = jsparser_buffer_last_identifier(js,acStack_38), iVar3 == 0 ||
          (pvVar4 = bsearch(acStack_38,regexp_token_prefix,0x2f,8,bsearch_strcmp),
          pvVar4 == (void *)0x0)))) goto LAB_00130f10;
    }
  }
LAB_00130f08:
  ctx->next_state = 6;
LAB_00130f10:
  jsparser_buffer_append_chr(js,chr);
  return;
}

Assistant:

static void enter_state_js_slash(statemachine_ctx *ctx, int start, char chr,
                                 int end)
{
  jsparser_ctx *js;
  char buffer[JSPARSER_RING_BUFFER_SIZE];
  int pos;

  assert(ctx != NULL);
  assert(ctx->user != NULL);

  js = CAST(jsparser_ctx *, ctx->user);
  assert(js != NULL);

  pos = -1;
  /* Consume the last whitespace. */
  if (js_is_whitespace(jsparser_buffer_get(js, pos))) {
    --pos;
  }

  switch (jsparser_buffer_get(js, pos)) {
    /* Ignore unary increment */
    case '+':
      if (jsparser_buffer_get(js, pos - 1) != '+') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* Ignore unary decrement */
    case '-':
      if (jsparser_buffer_get(js, pos - 1) != '-') {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
      break;

    /* List of punctuator endings except ), ], }, + and - */
    case '=':
    case '<':
    case '>':
    case '&':
    case '|':
    case '!':
    case '%':
    case '*':
    case '/':
    case ',':
    case ';':
    case '?':
    case ':':
    case '^':
    case '~':
    case '{':
    case '(':
    case '[':
    case '}':
    case '\0':
      ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      break;

    default:
      if (jsparser_buffer_last_identifier(js, buffer) &&
          is_regexp_token_prefix(buffer)) {
        ctx->next_state = JSPARSER_STATE_INT_JS_REGEXP_SLASH;
      }
  }

  jsparser_buffer_append_chr(js, chr);
}